

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

PPrototype * NewPrototype(TArray<PType_*,_PType_*> *rettypes,TArray<PType_*,_PType_*> *argtypes)

{
  PClass *len;
  PPrototype *local_28;
  PType *proto;
  size_t bucket;
  TArray<PType_*,_PType_*> *argtypes_local;
  TArray<PType_*,_PType_*> *rettypes_local;
  
  len = PPrototype::RegistrationInfo.MyClass;
  bucket = (size_t)argtypes;
  argtypes_local = rettypes;
  local_28 = (PPrototype *)
             FTypeTable::FindType
                       (&TypeTable,PPrototype::RegistrationInfo.MyClass,(intptr_t)argtypes,
                        (intptr_t)rettypes,(size_t *)&proto);
  if (local_28 == (PPrototype *)0x0) {
    local_28 = (PPrototype *)DObject::operator_new((DObject *)0xa0,(size_t)len);
    PPrototype::PPrototype(local_28,argtypes_local,(TArray<PType_*,_PType_*> *)bucket);
    FTypeTable::AddType(&TypeTable,(PType *)local_28,PPrototype::RegistrationInfo.MyClass,bucket,
                        (intptr_t)argtypes_local,(size_t)proto);
  }
  return local_28;
}

Assistant:

PPrototype *NewPrototype(const TArray<PType *> &rettypes, const TArray<PType *> &argtypes)
{
	size_t bucket;
	PType *proto = TypeTable.FindType(RUNTIME_CLASS(PPrototype), (intptr_t)&argtypes, (intptr_t)&rettypes, &bucket);
	if (proto == NULL)
	{
		proto = new PPrototype(rettypes, argtypes);
		TypeTable.AddType(proto, RUNTIME_CLASS(PPrototype), (intptr_t)&argtypes, (intptr_t)&rettypes, bucket);
	}
	return static_cast<PPrototype *>(proto);
}